

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O2

void __thiscall
LinearScan::RecordUse
          (LinearScan *this,Lifetime *lifetime,Instr *instr,RegOpnd *regOpnd,bool isFromBailout)

{
  uint uVar1;
  bool bVar2;
  BOOLEAN BVar3;
  BOOL BVar4;
  uint32 newUseValue;
  Instr *local_30;
  Instr *instr_local;
  
  newUseValue = 0;
  if (this->currentOpHelperBlock == (OpHelperBlock *)0x0 && !isFromBailout) {
    uVar1 = this->loopNest;
    if (uVar1 < 6) {
      newUseValue = 1 << ((char)uVar1 * '\x03' & 0x1fU);
    }
    else {
      newUseValue = uVar1 * 0x8000 - 0x28000;
    }
  }
  local_30 = instr;
  if (regOpnd == (RegOpnd *)0x0) {
LAB_005359fe:
    BVar4 = Func::HasTry(this->func);
    if (BVar4 != 0) {
      bVar2 = Func::DoOptimizeTry(this->func);
      if (((!bVar2) && (this->loopNest != 0)) && (lifetime->lastUseLabel != this->lastLabel)) {
        BVar3 = BVSparse<Memory::JitArenaAllocator>::Test
                          (this->liveOnBackEdgeSyms,(lifetime->sym->super_Sym).m_id);
        if ((BVar3 != '\0') &&
           ((lifetime->previousDefBlockNumber != this->currentBlockNumber ||
            ((SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)
             (lifetime->defList).super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>.
             super_SListNodeBase<Memory::ArenaAllocator>.next == &lifetime->defList))))
        goto LAB_005359cf;
      }
    }
    if (!isFromBailout) {
      Lifetime::SubFromUseCount(lifetime,newUseValue,this->curLoop);
    }
  }
  else {
    bVar2 = StackSym::IsConst(regOpnd->m_sym);
    if (!bVar2) goto LAB_005359fe;
LAB_005359cf:
    SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Prepend(&lifetime->useList,&local_30);
    lifetime->lastUseLabel = this->lastLabel;
    Lifetime::AddToUseCountAdjust(lifetime,newUseValue,this->curLoop,this->func);
  }
  if (this->loopNest != 0) {
    RecordLoopUse(this,lifetime,lifetime->reg);
  }
  return;
}

Assistant:

void
LinearScan::RecordUse(Lifetime * lifetime, IR::Instr * instr, IR::RegOpnd * regOpnd, bool isFromBailout)
{
    uint32 useCountCost = LinearScan::GetUseSpillCost(this->loopNest, (this->currentOpHelperBlock != nullptr || isFromBailout));

    // We only spill at the use for constants (i.e. reload) or for function with try blocks. We don't
    // have real accurate flow info for the later.
    if ((regOpnd && regOpnd->m_sym->IsConst())
          || (
                 (this->func->HasTry() && !this->func->DoOptimizeTry()) &&
                 this->IsInLoop() &&
                 lifetime->lastUseLabel != this->lastLabel &&
                 this->liveOnBackEdgeSyms->Test(lifetime->sym->m_id) &&
                 !(lifetime->previousDefBlockNumber == currentBlockNumber && !lifetime->defList.Empty())
             ))
    {
        // Keep track of all the uses of this lifetime in case we decide to spill it.
        // Note that we won't need to insert reloads if the use are not in a loop,
        // unless it is a const. We always reload const instead of spilling to the stack.
        //
        // We also don't need to insert reloads if the previous use was in the same basic block (the first use in the block
        // would have done the reload), or the previous def is in the same basic block and the value is still live. Furthermore,
        // if the previous def is in the same basic block, the value is still live, and there's another def after this use in
        // the same basic block, the previous def may not do a spill store, so we must not reload the value from the stack.
        lifetime->useList.Prepend(instr);
        lifetime->lastUseLabel = this->lastLabel;
        lifetime->AddToUseCountAdjust(useCountCost, this->curLoop, this->func);
    }
    else
    {
        if (!isFromBailout)
        {
            // Since we won't reload this use if the lifetime gets spilled, adjust the spill cost to reflect this.
            lifetime->SubFromUseCount(useCountCost, this->curLoop);
        }
    }
    if (this->IsInLoop())
    {
        this->RecordLoopUse(lifetime, lifetime->reg);
    }
}